

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001e2e20 = 0x2d2d2d2d2d2d2d;
    uRam00000000001e2e27._0_1_ = '-';
    uRam00000000001e2e27._1_1_ = '-';
    uRam00000000001e2e27._2_1_ = '-';
    uRam00000000001e2e27._3_1_ = '-';
    uRam00000000001e2e27._4_1_ = '-';
    uRam00000000001e2e27._5_1_ = '-';
    uRam00000000001e2e27._6_1_ = '-';
    uRam00000000001e2e27._7_1_ = '-';
    DAT_001e2e10 = '-';
    DAT_001e2e10_1._0_1_ = '-';
    DAT_001e2e10_1._1_1_ = '-';
    DAT_001e2e10_1._2_1_ = '-';
    DAT_001e2e10_1._3_1_ = '-';
    DAT_001e2e10_1._4_1_ = '-';
    DAT_001e2e10_1._5_1_ = '-';
    DAT_001e2e10_1._6_1_ = '-';
    uRam00000000001e2e18 = 0x2d2d2d2d2d2d2d;
    DAT_001e2e1f = 0x2d;
    DAT_001e2e00 = '-';
    DAT_001e2e00_1._0_1_ = '-';
    DAT_001e2e00_1._1_1_ = '-';
    DAT_001e2e00_1._2_1_ = '-';
    DAT_001e2e00_1._3_1_ = '-';
    DAT_001e2e00_1._4_1_ = '-';
    DAT_001e2e00_1._5_1_ = '-';
    DAT_001e2e00_1._6_1_ = '-';
    uRam00000000001e2e08._0_1_ = '-';
    uRam00000000001e2e08._1_1_ = '-';
    uRam00000000001e2e08._2_1_ = '-';
    uRam00000000001e2e08._3_1_ = '-';
    uRam00000000001e2e08._4_1_ = '-';
    uRam00000000001e2e08._5_1_ = '-';
    uRam00000000001e2e08._6_1_ = '-';
    uRam00000000001e2e08._7_1_ = '-';
    DAT_001e2df0 = '-';
    DAT_001e2df0_1._0_1_ = '-';
    DAT_001e2df0_1._1_1_ = '-';
    DAT_001e2df0_1._2_1_ = '-';
    DAT_001e2df0_1._3_1_ = '-';
    DAT_001e2df0_1._4_1_ = '-';
    DAT_001e2df0_1._5_1_ = '-';
    DAT_001e2df0_1._6_1_ = '-';
    uRam00000000001e2df8._0_1_ = '-';
    uRam00000000001e2df8._1_1_ = '-';
    uRam00000000001e2df8._2_1_ = '-';
    uRam00000000001e2df8._3_1_ = '-';
    uRam00000000001e2df8._4_1_ = '-';
    uRam00000000001e2df8._5_1_ = '-';
    uRam00000000001e2df8._6_1_ = '-';
    uRam00000000001e2df8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001e2de8._0_1_ = '-';
    uRam00000000001e2de8._1_1_ = '-';
    uRam00000000001e2de8._2_1_ = '-';
    uRam00000000001e2de8._3_1_ = '-';
    uRam00000000001e2de8._4_1_ = '-';
    uRam00000000001e2de8._5_1_ = '-';
    uRam00000000001e2de8._6_1_ = '-';
    uRam00000000001e2de8._7_1_ = '-';
    DAT_001e2e2f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}